

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O3

Point2<float> * __thiscall
pbrt::BufferCache<pbrt::Point2<float>_>::LookupOrAdd
          (BufferCache<pbrt::Point2<float>_> *this,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *buf)

{
  memory_resource *pmVar1;
  int iVar2;
  iterator iVar3;
  Point2<float> *__dest;
  pointer __src;
  size_t __n;
  pointer pPVar4;
  __hashtable *__h;
  long in_FS_OFFSET;
  __node_gen_type __node_gen;
  Buffer lookupBuffer;
  key_type local_38;
  undefined4 extraout_var;
  
  *(long *)(in_FS_OFFSET + -0x2f8) = *(long *)(in_FS_OFFSET + -0x2f8) + 1;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  local_38.ptr = (buf->
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_38.size =
       (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish - (long)local_38.ptr >> 3;
  iVar3 = std::
          _Hashtable<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_std::allocator<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer>,_pbrt::BufferCache<pbrt::Point2<float>_>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->cache)._M_h,&local_38);
  if (iVar3.super__Node_iterator_base<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true>._M_cur
      == (__node_type *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])
                      (pmVar1,(long)(buf->
                                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(buf->
                                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,4);
    __dest = (Point2<float> *)CONCAT44(extraout_var,iVar2);
    __src = (buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)__src;
    pPVar4 = __src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
      __src = (buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
      pPVar4 = (buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    }
    this->bytesUsed = (long)__src + (this->bytesUsed - (long)pPVar4);
    std::
    _Hashtable<pbrt::BufferCache<pbrt::Point2<float>>::Buffer,pbrt::BufferCache<pbrt::Point2<float>>::Buffer,std::allocator<pbrt::BufferCache<pbrt::Point2<float>>::Buffer>,std::__detail::_Identity,std::equal_to<pbrt::BufferCache<pbrt::Point2<float>>::Buffer>,pbrt::BufferCache<pbrt::Point2<float>>::BufferHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<pbrt::BufferCache<pbrt::Point2<float>>::Buffer,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<pbrt::BufferCache<pbrt::Point2<float>>::Buffer,true>>>>
              ((_Hashtable<pbrt::BufferCache<pbrt::Point2<float>>::Buffer,pbrt::BufferCache<pbrt::Point2<float>>::Buffer,std::allocator<pbrt::BufferCache<pbrt::Point2<float>>::Buffer>,std::__detail::_Identity,std::equal_to<pbrt::BufferCache<pbrt::Point2<float>>::Buffer>,pbrt::BufferCache<pbrt::Point2<float>>::BufferHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->cache);
  }
  else {
    *(long *)(in_FS_OFFSET + -0x300) = *(long *)(in_FS_OFFSET + -0x300) + 1;
    *(long *)(in_FS_OFFSET + -0x308) =
         (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_end_of_storage +
         (*(long *)(in_FS_OFFSET + -0x308) -
         (long)(buf->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start);
    __dest = *(Point2<float> **)
              ((long)iVar3.
                     super__Node_iterator_base<pbrt::BufferCache<pbrt::Point2<float>_>::Buffer,_true>
                     ._M_cur + 8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return __dest;
}

Assistant:

const T *LookupOrAdd(const std::vector<T> &buf) {
        ++nBufferCacheLookups;
        std::lock_guard<std::mutex> lock(mutex);
        // Return pointer to data if _buf_ contents is already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        if (auto iter = cache.find(lookupBuffer); iter != cache.end()) {
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.capacity() * sizeof(T);
            return iter->ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        cache.insert(Buffer(ptr, buf.size()));
        return ptr;
    }